

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  ulong uVar3;
  uint uVar4;
  float *__src;
  uint uVar5;
  byte *__dest;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  uint16_t outValue;
  float outValue_1;
  ushort local_50;
  allocator_type local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  float local_3c;
  ulong local_38;
  
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  local_4c = targetBits >> 3;
  local_48 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(local_4c * numChannels * (this->super_Image).height * (this->super_Image).width
                    ),&local_4d);
  pvVar2 = local_48;
  if ((this->super_Image).height != 0) {
    local_38 = (ulong)local_4c;
    uVar6 = 0;
    do {
      if ((this->super_Image).width != 0) {
        uVar9 = 0;
        do {
          if (numChannels != 0) {
            uVar8 = 0;
            do {
              uVar5 = (this->super_Image).width * uVar6 + uVar9;
              uVar7 = (uint)uVar8;
              uVar3 = 3;
              if (uVar7 < 3) {
                uVar3 = uVar8;
              }
              bVar1 = this->pixels[uVar5].field_0.comps[uVar3];
              __dest = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start +
                       (uVar5 * numChannels + uVar7) * local_4c;
              if (targetBits == 0x20) {
                local_3c = (float)bVar1;
                __src = &local_3c;
LAB_0015ff98:
                memcpy(__dest,__src,local_38);
                pvVar2 = local_48;
              }
              else {
                if (targetBits == 0x10) {
                  fVar10 = (float)bVar1;
                  uVar5 = (uint)fVar10 >> 0x17;
                  if (uVar5 == 0) {
                    local_50 = 0;
                  }
                  else if (uVar5 == 0xff) {
                    local_50 = (((uint)fVar10 & 0x7fffff) != 0 | 0x3e) << 9;
                  }
                  else {
                    local_50 = 0x7c00;
                    if ((uint)fVar10 < 0x47800000) {
                      if ((uint)fVar10 < 0x38800000) {
                        if ((uint)fVar10 < 0x33000000) {
                          local_50 = 0;
                          goto LAB_0015ff89;
                        }
                        uVar4 = (uint)fVar10 & 0x7fffff | 0x800000;
                        local_50 = (ushort)(uVar4 >> (0x7eU - (char)uVar5 & 0x1f)) & 0x3ff;
                        uVar4 = uVar4 >> ((byte)(0x7d - (char)uVar5) & 0x1f);
                      }
                      else {
                        local_50 = ((ushort)((uint)fVar10 >> 0xd) & 0x3ff |
                                   (ushort)((uVar5 & 0x1f) << 10)) ^ 0x4000;
                        uVar4 = (uint)fVar10 >> 0xc;
                      }
                      local_50 = local_50 + ((uVar4 & 1) != 0);
                    }
LAB_0015ff89:
                    local_50 = local_50 & 0x7fff;
                  }
                  __src = (float *)&local_50;
                  goto LAB_0015ff98;
                }
                if (targetBits == 8) {
                  *__dest = bVar1;
                }
              }
              uVar8 = (ulong)(uVar7 + 1);
            } while (numChannels != uVar7 + 1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->super_Image).width);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->super_Image).height);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }